

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_tcpdial.c
# Opt level: O0

void nni_posix_tcp_dial_cb(void *arg,uint ev)

{
  int iVar1;
  int *piVar2;
  socklen_t local_40;
  int fd;
  socklen_t sz;
  int nd;
  int ka;
  int rv;
  nni_aio *aio;
  nni_tcp_dialer *d;
  nni_tcp_conn *c;
  void *pvStack_10;
  uint ev_local;
  void *arg_local;
  
  aio = *(nni_aio **)((long)arg + 0xd8);
  d = (nni_tcp_dialer *)arg;
  c._4_4_ = ev;
  pvStack_10 = arg;
  nni_mtx_lock((nni_mtx *)&(aio->a_task).task_cv.mtx);
  _ka = *(nni_aio **)&d->ref;
  if ((_ka == (nni_aio *)0x0) || (iVar1 = nni_aio_list_active(_ka), iVar1 == 0)) {
    nni_mtx_unlock((nni_mtx *)&(aio->a_task).task_cv.mtx);
  }
  else {
    if ((c._4_4_ & 0x20) == 0) {
      local_40 = 4;
      iVar1 = nni_posix_pfd_fd((nni_posix_pfd *)((d->src).__ss_padding + 0x16));
      iVar1 = getsockopt(iVar1,1,4,&nd,&local_40);
      if (iVar1 < 0) {
        piVar2 = __errno_location();
        nd = *piVar2;
      }
      if (nd == 0x73) {
        nni_mtx_unlock((nni_mtx *)&(aio->a_task).task_cv.mtx);
        return;
      }
      if (nd != 0) {
        nd = nni_plat_errno(nd);
      }
    }
    else {
      nd = 9;
    }
    *(undefined8 *)&d->ref = 0;
    nni_aio_list_remove(_ka);
    nni_aio_set_prov_data(_ka,(void *)0x0);
    fd = (int)((aio->a_sleep & 1U) != 0);
    sz = (socklen_t)((aio->a_expire_ok & 1U) != 0);
    nni_mtx_unlock((nni_mtx *)&(aio->a_task).task_cv.mtx);
    if (nd == 0) {
      nni_posix_tcp_start((nni_tcp_conn *)d,fd,sz);
      nni_aio_set_output(_ka,0,d);
      nni_aio_finish(_ka,NNG_OK,0);
    }
    else {
      nng_stream_close((nng_stream *)d);
      nng_stream_free((nng_stream *)d);
      nni_aio_finish_error(_ka,nd);
    }
  }
  return;
}

Assistant:

void
nni_posix_tcp_dial_cb(void *arg, unsigned ev)
{
	nni_tcp_conn   *c = arg;
	nni_tcp_dialer *d = c->dialer;
	nni_aio        *aio;
	int             rv;
	int             ka;
	int             nd;

	nni_mtx_lock(&d->mtx);
	aio = c->dial_aio;
	if ((aio == NULL) || (!nni_aio_list_active(aio))) {
		nni_mtx_unlock(&d->mtx);
		return;
	}

	if ((ev & NNI_POLL_INVAL) != 0) {
		rv = EBADF;

	} else {
		socklen_t sz = sizeof(int);
		int       fd = nni_posix_pfd_fd(&c->pfd);
		if (getsockopt(fd, SOL_SOCKET, SO_ERROR, &rv, &sz) < 0) {
			rv = errno;
		}
		if (rv == EINPROGRESS) {
			// Connection still in progress, come back
			// later.
			nni_mtx_unlock(&d->mtx);
			return;
		} else if (rv != 0) {
			rv = nni_plat_errno(rv);
		}
	}

	c->dial_aio = NULL;
	nni_aio_list_remove(aio);
	nni_aio_set_prov_data(aio, NULL);
	nd = d->nodelay ? 1 : 0;
	ka = d->keepalive ? 1 : 0;

	nni_mtx_unlock(&d->mtx);

	if (rv != 0) {
		nng_stream_close(&c->stream);
		nng_stream_free(&c->stream);
		nni_aio_finish_error(aio, rv);
		return;
	}

	nni_posix_tcp_start(c, nd, ka);
	nni_aio_set_output(aio, 0, c);
	nni_aio_finish(aio, 0, 0);
}